

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O1

mat4 * dja::operator*(mat4 *__return_storage_ptr__,mat4 *a,mat4 *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  mat4 *pmVar5;
  int j;
  long lVar6;
  long lVar7;
  mat4 t;
  
  pmVar5 = __return_storage_ptr__;
  t.m[0].y = b->m[1].x;
  t.m[0].x = b->m[0].x;
  t.m[0].w = b->m[3].x;
  t.m[0].z = b->m[2].x;
  t.m[1].y = b->m[1].y;
  t.m[1].x = b->m[0].y;
  t.m[1].w = b->m[3].y;
  t.m[1].z = b->m[2].y;
  t.m[2].y = b->m[1].z;
  t.m[2].x = b->m[0].z;
  t.m[2].w = b->m[3].z;
  t.m[2].z = b->m[2].z;
  t.m[3].y = b->m[1].w;
  t.m[3].x = b->m[0].w;
  t.m[3].w = b->m[3].w;
  t.m[3].z = b->m[2].w;
  __return_storage_ptr__->m[0].x = 0.0;
  __return_storage_ptr__->m[0].y = 0.0;
  __return_storage_ptr__->m[0].z = 0.0;
  __return_storage_ptr__->m[0].w = 0.0;
  __return_storage_ptr__->m[1].x = 0.0;
  __return_storage_ptr__->m[1].y = 0.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 0.0;
  __return_storage_ptr__->m[2].w = 0.0;
  __return_storage_ptr__->m[3].x = 0.0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 0.0;
  __return_storage_ptr__->m[0].x = 1.0;
  __return_storage_ptr__->m[0].y = 0.0;
  __return_storage_ptr__->m[0].z = 0.0;
  *(undefined8 *)&__return_storage_ptr__->m[0].w = 0;
  __return_storage_ptr__->m[1].y = 1.0;
  __return_storage_ptr__->m[1].z = 0.0;
  __return_storage_ptr__->m[1].w = 0.0;
  __return_storage_ptr__->m[2].x = 0.0;
  __return_storage_ptr__->m[2].y = 0.0;
  __return_storage_ptr__->m[2].z = 1.0;
  *(undefined8 *)&__return_storage_ptr__->m[2].w = 0;
  __return_storage_ptr__->m[3].y = 0.0;
  __return_storage_ptr__->m[3].z = 0.0;
  __return_storage_ptr__->m[3].w = 1.0;
  lVar6 = 0;
  do {
    fVar1 = a->m[lVar6].x;
    fVar2 = a->m[lVar6].y;
    fVar3 = a->m[lVar6].z;
    fVar4 = a->m[lVar6].w;
    lVar7 = 0;
    do {
      *(float *)((long)&((vec4 *)&__return_storage_ptr__->m[0].x)->x + lVar7) =
           (&t.m[0].w)[lVar7] * fVar4 +
           (&t.m[0].z)[lVar7] * fVar3 + (&t.m[0].x)[lVar7] * fVar1 + (&t.m[0].y)[lVar7] * fVar2;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0x10);
    lVar6 = lVar6 + 1;
    __return_storage_ptr__ = (mat4 *)((long)__return_storage_ptr__ + 0x10);
  } while (lVar6 != 4);
  return pmVar5;
}

Assistant:

mat4 operator*(const mat4& a, const mat4& b)
{
    mat4 t = transpose(b), r;

    for (int j = 0; j < 4; ++j)
    for (int i = 0; i < 4; ++i)
        r[j][i] = dot(a[j], t[i]);

    return r;
}